

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

Upvalue * __thiscall luna::GC::NewUpvalue(GC *this,GCGeneration gen)

{
  Upvalue *obj;
  
  obj = (Upvalue *)operator_new(0x28);
  (obj->super_GCObject).next_ = (GCObject *)0x0;
  (obj->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__GCObject_001996a8;
  (obj->value_).field_0.obj_ = (GCObject *)0x0;
  (obj->value_).type_ = ValueT_Nil;
  (obj->super_GCObject).field_0x10 = 0x40;
  SetObjectGen(this,(GCObject *)obj,gen);
  return obj;
}

Assistant:

Upvalue * GC::NewUpvalue(GCGeneration gen)
    {
        auto u = new Upvalue;
        u->gc_obj_type_ = GCObjectType_Upvalue;
        SetObjectGen(u, gen);
        return u;
    }